

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O0

int jpc_ns_analyze(jpc_fix_t *a,int xstart,int ystart,int width,int height,int stride)

{
  uint parity;
  uint uVar1;
  uint local_4c;
  uint local_48;
  uint i_1;
  uint i;
  uint maxcols;
  jpc_fix_t *startptr;
  uint colparity;
  uint rowparity;
  uint numcols;
  uint numrows;
  int stride_local;
  int height_local;
  int width_local;
  int ystart_local;
  int xstart_local;
  jpc_fix_t *a_local;
  
  parity = ystart & 1;
  uVar1 = width & 0xfffffff0;
  _i = a;
  for (local_48 = 0; local_48 < uVar1; local_48 = local_48 + 0x10) {
    jpc_qmfb_split_colgrp(_i,height,stride,parity);
    jpc_ns_fwdlift_colgrp(_i,height,stride,parity);
    _i = _i + 0x10;
  }
  if (uVar1 < (uint)width) {
    jpc_qmfb_split_colres(_i,height,width - uVar1,stride,parity);
    jpc_ns_fwdlift_colres(_i,height,width - uVar1,stride,parity);
  }
  _i = a;
  for (local_4c = 0; local_4c < (uint)height; local_4c = local_4c + 1) {
    jpc_qmfb_split_row(_i,width,xstart & 1U);
    jpc_ns_fwdlift_row(_i,width,xstart & 1U);
    _i = _i + stride;
  }
  return 0;
}

Assistant:

int jpc_ns_analyze(jpc_fix_t *a, int xstart, int ystart, int width, int height,
  int stride)
{

	const unsigned numrows = height;
	const unsigned numcols = width;
	const unsigned rowparity = ystart & 1;
	const unsigned colparity = xstart & 1;
	jpc_fix_t *startptr;

	const unsigned maxcols = (numcols / JPC_QMFB_COLGRPSIZE) * JPC_QMFB_COLGRPSIZE;
	startptr = &a[0];
	for (unsigned i = 0; i < maxcols; i += JPC_QMFB_COLGRPSIZE) {
		jpc_qmfb_split_colgrp(startptr, numrows, stride, rowparity);
		jpc_ns_fwdlift_colgrp(startptr, numrows, stride, rowparity);
		startptr += JPC_QMFB_COLGRPSIZE;
	}
	if (maxcols < numcols) {
		jpc_qmfb_split_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
		jpc_ns_fwdlift_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
	}

	startptr = &a[0];
	for (unsigned i = 0; i < numrows; ++i) {
		jpc_qmfb_split_row(startptr, numcols, colparity);
		jpc_ns_fwdlift_row(startptr, numcols, colparity);
		startptr += stride;
	}

	return 0;

}